

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

ExprP<tcu::Vector<float,_3>_> __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::Cross::doExpand
          (Cross *this,ExpandContext *param_1,ArgExprs *x)

{
  int i;
  int in_ECX;
  SharedPtrStateBase *extraout_RDX;
  ExprP<tcu::Vector<float,_3>_> EVar1;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> SStack_168;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_158;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_148;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_138;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_128;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_118;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_108;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_f8;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_e8;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_d8;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_c8;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_b8;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_a8;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_98;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_88;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_78;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_68;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_58;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_48;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_38;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_28;
  
  ContainerExprPBase<tcu::Vector<float,_3>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_3>_> *)&local_48,in_ECX);
  i = in_ECX + 0x10;
  ContainerExprPBase<tcu::Vector<float,_3>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_3>_> *)&local_58,i);
  BuiltinPrecisionTests::operator*
            ((BuiltinPrecisionTests *)&local_38,(ExprP<float> *)&local_48,(ExprP<float> *)&local_58)
  ;
  ContainerExprPBase<tcu::Vector<float,_3>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_3>_> *)&local_78,i);
  ContainerExprPBase<tcu::Vector<float,_3>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_3>_> *)&local_88,in_ECX);
  BuiltinPrecisionTests::operator*
            ((BuiltinPrecisionTests *)&local_68,(ExprP<float> *)&local_78,(ExprP<float> *)&local_88)
  ;
  BuiltinPrecisionTests::operator-
            ((BuiltinPrecisionTests *)&local_28,(ExprP<float> *)&local_38,(ExprP<float> *)&local_68)
  ;
  ContainerExprPBase<tcu::Vector<float,_3>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_3>_> *)&local_b8,in_ECX);
  ContainerExprPBase<tcu::Vector<float,_3>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_3>_> *)&local_c8,i);
  BuiltinPrecisionTests::operator*
            ((BuiltinPrecisionTests *)&local_a8,(ExprP<float> *)&local_b8,(ExprP<float> *)&local_c8)
  ;
  ContainerExprPBase<tcu::Vector<float,_3>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_3>_> *)&local_e8,i);
  ContainerExprPBase<tcu::Vector<float,_3>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_3>_> *)&local_f8,in_ECX);
  BuiltinPrecisionTests::operator*
            ((BuiltinPrecisionTests *)&local_d8,(ExprP<float> *)&local_e8,(ExprP<float> *)&local_f8)
  ;
  BuiltinPrecisionTests::operator-
            ((BuiltinPrecisionTests *)&local_98,(ExprP<float> *)&local_a8,(ExprP<float> *)&local_d8)
  ;
  ContainerExprPBase<tcu::Vector<float,_3>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_3>_> *)&local_128,in_ECX);
  ContainerExprPBase<tcu::Vector<float,_3>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_3>_> *)&local_138,i);
  BuiltinPrecisionTests::operator*
            ((BuiltinPrecisionTests *)&local_118,(ExprP<float> *)&local_128,
             (ExprP<float> *)&local_138);
  ContainerExprPBase<tcu::Vector<float,_3>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_3>_> *)&local_158,i);
  ContainerExprPBase<tcu::Vector<float,_3>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_3>_> *)&SStack_168,in_ECX);
  BuiltinPrecisionTests::operator*
            ((BuiltinPrecisionTests *)&local_148,(ExprP<float> *)&local_158,
             (ExprP<float> *)&SStack_168);
  BuiltinPrecisionTests::operator-
            ((BuiltinPrecisionTests *)&local_108,(ExprP<float> *)&local_118,
             (ExprP<float> *)&local_148);
  vec3((Functions *)this,(ExprP<float> *)&local_28,(ExprP<float> *)&local_98,
       (ExprP<float> *)&local_108);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_108);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_148);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&SStack_168);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_158);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_118);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_138);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_128);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_98);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_d8);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_f8);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_e8);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_a8);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_c8);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_b8);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_28);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_68);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_88);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_78);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_38);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_58);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_48);
  EVar1.super_ContainerExprPBase<tcu::Vector<float,_3>_>.super_ExprPBase<tcu::Vector<float,_3>_>.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_3>_>_>.m_state =
       extraout_RDX;
  EVar1.super_ContainerExprPBase<tcu::Vector<float,_3>_>.super_ExprPBase<tcu::Vector<float,_3>_>.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_3>_>_>.m_ptr =
       (Expr<tcu::Vector<float,_3>_> *)this;
  return (ExprP<tcu::Vector<float,_3>_>)
         EVar1.super_ContainerExprPBase<tcu::Vector<float,_3>_>.
         super_ExprPBase<tcu::Vector<float,_3>_>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_3>_>_>;
}

Assistant:

ExprP<Vec3>		doExpand	(ExpandContext&, const ArgExprs& x) const
	{
		return vec3(x.a[1] * x.b[2] - x.b[1] * x.a[2],
					x.a[2] * x.b[0] - x.b[2] * x.a[0],
					x.a[0] * x.b[1] - x.b[0] * x.a[1]);
	}